

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O2

void __thiscall duckdb::Iterator::PopNode(Iterator *this)

{
  byte bVar1;
  _Elt_pointer pIVar2;
  IteratorEntry *pIVar3;
  idx_t iVar4;
  _Elt_pointer pIVar5;
  _Elt_pointer pIVar6;
  _Elt_pointer pIVar7;
  Prefix prefix;
  
  pIVar5 = (this->nodes).c.
           super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  pIVar2 = (this->nodes).c.
           super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first;
  if (pIVar5 == pIVar2) {
    pIVar3 = (this->nodes).c.
             super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1];
    pIVar7 = pIVar3 + 0x1f;
    pIVar6 = pIVar3 + 0x20;
  }
  else {
    pIVar7 = pIVar5 + -1;
    pIVar6 = pIVar5;
  }
  iVar4 = (pIVar7->node).super_IndexPointer.data;
  if ((pIVar6[-1].node.super_IndexPointer.data & 0x7f00000000000000) == 0x100000000000000) {
    if (pIVar5 == pIVar2) {
      pIVar5 = (this->nodes).c.
               super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    Prefix::Prefix(&prefix,this->art,(Node)pIVar5[-1].node.super_IndexPointer.data,false,false);
    bVar1 = prefix.data[this->art->prefix_count];
    IteratorKey::Pop(&this->current_key,(ulong)bVar1);
    if (this->status == GATE_SET) {
      this->nested_depth = this->nested_depth - bVar1;
    }
  }
  else {
    IteratorKey::Pop(&this->current_key,1);
    if (this->status == GATE_SET) {
      this->nested_depth = this->nested_depth + 0xff;
    }
  }
  ::std::deque<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>::pop_back
            (&(this->nodes).c);
  if ((long)iVar4 < 0) {
    this->status = GATE_NOT_SET;
  }
  return;
}

Assistant:

void Iterator::PopNode() {
	auto gate_status = nodes.top().node.GetGateStatus();

	// Pop the byte and the node.
	if (nodes.top().node.GetType() != NType::PREFIX) {
		current_key.Pop(1);
		if (status == GateStatus::GATE_SET) {
			nested_depth--;
			D_ASSERT(nested_depth < Prefix::ROW_ID_SIZE);
		}

	} else {
		// Pop all prefix bytes and the node.
		Prefix prefix(art, nodes.top().node);
		auto prefix_byte_count = prefix.data[Prefix::Count(art)];
		current_key.Pop(prefix_byte_count);

		if (status == GateStatus::GATE_SET) {
			nested_depth -= prefix_byte_count;
			D_ASSERT(nested_depth < Prefix::ROW_ID_SIZE);
		}
	}
	nodes.pop();

	// We are popping a gate node.
	if (gate_status == GateStatus::GATE_SET) {
		D_ASSERT(status == GateStatus::GATE_SET);
		status = GateStatus::GATE_NOT_SET;
	}
}